

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O2

string * __thiscall m2d::savanna::url::port_str_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  bool bVar1;
  __type_conflict1 _Var2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator==(&this->port_,"");
  if (!bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->port_);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_60,(string *)this);
  _Var2 = std::operator==(&local_60,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          url_scheme::https_abi_cxx11_);
  if (_Var2) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)this);
    _Var2 = std::operator==(&local_40,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            url_scheme::wss_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (!_Var2) {
      pcVar3 = "80";
      goto LAB_001266f5;
    }
  }
  pcVar3 = "443";
LAB_001266f5:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string port_str()
		{
			if (port_ == "") {
				if (scheme() == savanna::url_scheme::https || scheme() == savanna::url_scheme::wss) {
					return "443";
				}
				return "80";
			}

			return port_;
		}